

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O0

void __thiscall
ClCommandLine_DoubleDashStringOptionWithSingleDash_Test::TestBody
          (ClCommandLine_DoubleDashStringOptionWithSingleDash_Test *this)

{
  bool bVar1;
  char *pcVar2;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matcher;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matcher_00;
  char *in_R9;
  AssertHelper local_568;
  Message local_560;
  uint local_554;
  string local_550 [32];
  unsigned_long local_530;
  undefined1 local_528 [8];
  AssertionResult gtest_ar_2;
  Message local_510;
  string local_508 [32];
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e8;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4c8;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar_1;
  Message local_490;
  string local_488 [32];
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_468;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_448;
  undefined1 local_428 [8];
  AssertionResult gtest_ar;
  AssertHelper local_3f8;
  Message local_3f0;
  bool local_3e1;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_;
  ostringstream local_3c8 [7];
  bool res;
  string_stream errors;
  ostringstream local_250 [8];
  string_stream output;
  allocator local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  opt<bool,_pstore::command_line::parser<bool,_void>_> option;
  ClCommandLine_DoubleDashStringOptionWithSingleDash_Test *this_local;
  
  option._136_8_ = this;
  pstore::command_line::opt<bool,_pstore::command_line::parser<bool,_void>_>::opt<char[4]>
            ((opt<bool,_pstore::command_line::parser<bool,_void>_> *)local_a0,(char (*) [4])0x1e21b0
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"progname",&local_c1);
  (anonymous_namespace)::ClCommandLine::add<char_const*>((ClCommandLine *)this,&local_c0,"-arg");
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::ostringstream::ostringstream(local_250);
  std::__cxx11::ostringstream::ostringstream(local_3c8);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ =
       anon_unknown.dwarf_19dfa::ClCommandLine::parse_command_line_options
                 (&this->super_ClCommandLine,(string_stream *)local_250,(string_stream *)local_3c8);
  local_3e1 = (bool)(~gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._7_1_ & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3e0,&local_3e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
  if (!bVar1) {
    testing::Message::Message(&local_3f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_3e0,(AssertionResult *)0x1e9800,"true"
               ,"false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0xa8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
    testing::internal::AssertHelper::~AssertHelper(&local_3f8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
  testing::HasSubstr<char[30]>(&local_468,(StringLike<char[30]> *)"Unknown command line argument");
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
            (&local_448,(internal *)&local_468,matcher);
  std::__cxx11::ostringstream::str();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_428,(char *)&local_448,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"errors.str ()")
  ;
  std::__cxx11::string::~string(local_488);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_448);
  testing::
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher(&local_468);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
  if (!bVar1) {
    testing::Message::Message(&local_490);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0xaa,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_490);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_490);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
  testing::HasSubstr<char[8]>(&local_4e8,(StringLike<char[8]> *)"\'--arg\'");
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
            (&local_4c8,(internal *)&local_4e8,matcher_00);
  std::__cxx11::ostringstream::str();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_4a8,(char *)&local_4c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"errors.str ()")
  ;
  std::__cxx11::string::~string(local_508);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_4c8);
  testing::
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher(&local_4e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar1) {
    testing::Message::Message(&local_510);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0xab,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_510);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  std::__cxx11::ostringstream::str();
  local_530 = std::__cxx11::string::length();
  local_554 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_528,"output.str ().length ()","0U",&local_530,&local_554);
  std::__cxx11::string::~string(local_550);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
  if (!bVar1) {
    testing::Message::Message(&local_560);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_528);
    testing::internal::AssertHelper::AssertHelper
              (&local_568,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0xac,pcVar2);
    testing::internal::AssertHelper::operator=(&local_568,&local_560);
    testing::internal::AssertHelper::~AssertHelper(&local_568);
    testing::Message::~Message(&local_560);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
  std::__cxx11::ostringstream::~ostringstream(local_3c8);
  std::__cxx11::ostringstream::~ostringstream(local_250);
  pstore::command_line::opt<bool,_pstore::command_line::parser<bool,_void>_>::~opt
            ((opt<bool,_pstore::command_line::parser<bool,_void>_> *)local_a0);
  return;
}

Assistant:

TEST_F (ClCommandLine, DoubleDashStringOptionWithSingleDash) {
    opt<bool> option ("arg");
    this->add ("progname", "-arg");

    string_stream output;
    string_stream errors;
    bool const res = this->parse_command_line_options (output, errors);
    EXPECT_FALSE (res);
    EXPECT_THAT (errors.str (),
                 testing::HasSubstr (PSTORE_NATIVE_TEXT ("Unknown command line argument")));
    EXPECT_THAT (errors.str (), testing::HasSubstr (PSTORE_NATIVE_TEXT ("'--arg'")));
    EXPECT_EQ (output.str ().length (), 0U);
}